

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

amqp_connection_state_t setup_connection_and_channel(void)

{
  amqp_channel_open_ok_t *paVar1;
  amqp_channel_open_ok_t *res;
  amqp_rpc_reply_t rpc_reply;
  int rc;
  amqp_socket_t *socket;
  amqp_connection_state_t connection_state_;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  amqp_socket_t *in_stack_ffffffffffffffb0;
  amqp_channel_t channel;
  amqp_connection_state_t in_stack_ffffffffffffffc0;
  int local_38;
  int local_14;
  amqp_pool_table_entry_t *local_10;
  amqp_connection_state_t local_8;
  
  local_8 = amqp_new_connection();
  local_10 = (amqp_pool_table_entry_t *)
             amqp_tcp_socket_new((amqp_connection_state_t)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (local_10 == (amqp_pool_table_entry_t *)0x0) {
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x1e,"amqp_connection_state_t setup_connection_and_channel(void)");
  }
  local_14 = amqp_socket_open(in_stack_ffffffffffffffb0,
                              (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              0);
  if (local_14 != 0) {
    __assert_fail("rc == AMQP_STATUS_OK",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x21,"amqp_connection_state_t setup_connection_and_channel(void)");
  }
  channel = 0;
  amqp_login((amqp_connection_state_t)&stack0xffffffffffffffc8,(char *)local_8,0x1180a9,1,0x20000,
             AMQP_SASL_METHOD_PLAIN,0,"guest");
  if (local_38 != 1) {
    __assert_fail("rpc_reply.reply_type == AMQP_RESPONSE_NORMAL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                  ,0x26,"amqp_connection_state_t setup_connection_and_channel(void)");
  }
  paVar1 = amqp_channel_open(in_stack_ffffffffffffffc0,channel);
  if (paVar1 != (amqp_channel_open_ok_t *)0x0) {
    return local_8;
  }
  __assert_fail("res != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                ,0x2a,"amqp_connection_state_t setup_connection_and_channel(void)");
}

Assistant:

amqp_connection_state_t setup_connection_and_channel(void) {
  amqp_connection_state_t connection_state_ = amqp_new_connection();

  amqp_socket_t *socket = amqp_tcp_socket_new(connection_state_);
  assert(socket);

  int rc = amqp_socket_open(socket, "localhost", AMQP_PROTOCOL_PORT);
  assert(rc == AMQP_STATUS_OK);

  amqp_rpc_reply_t rpc_reply = amqp_login(
      connection_state_, "/", 1, AMQP_DEFAULT_FRAME_SIZE,
      AMQP_DEFAULT_HEARTBEAT, AMQP_SASL_METHOD_PLAIN, "guest", "guest");
  assert(rpc_reply.reply_type == AMQP_RESPONSE_NORMAL);

  amqp_channel_open_ok_t *res =
      amqp_channel_open(connection_state_, fixed_channel_id);
  assert(res != NULL);

  return connection_state_;
}